

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O2

Pseudo * create_indexed_pseudo
                   (Proc *proc,ravitype_t container_type,Pseudo *container_pseudo,
                   ravitype_t key_type,Pseudo *key_pseudo,ravitype_t target_type,uint line_number)

{
  byte *pbVar1;
  Pseudo *pPVar2;
  
  if (((undefined1  [48])*container_pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
    __assert_fail("container_pseudo->type != PSEUDO_INDEXED",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0x4e6,
                  "Pseudo *create_indexed_pseudo(Proc *, ravitype_t, Pseudo *, ravitype_t, Pseudo *, ravitype_t, unsigned int)"
                 );
  }
  if (((undefined1  [48])*key_pseudo & (undefined1  [48])0xf) != (undefined1  [48])0xe) {
    pPVar2 = allocate_indexed_pseudo(proc);
    (pPVar2->field_3).index_info.line_number = line_number;
    (pPVar2->field_3).index_info.container_type = container_type;
    (pPVar2->field_3).index_info.key_type = key_type;
    (pPVar2->field_3).index_info.target_type = target_type;
    (pPVar2->field_3).index_info.container = container_pseudo;
    (pPVar2->field_3).index_info.key = key_pseudo;
    pbVar1 = (byte *)((long)&pPVar2->field_3 + 0xc);
    *pbVar1 = *pbVar1 & 0xfe;
    return pPVar2;
  }
  __assert_fail("key_pseudo->type != PSEUDO_INDEXED",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                ,0x4e7,
                "Pseudo *create_indexed_pseudo(Proc *, ravitype_t, Pseudo *, ravitype_t, Pseudo *, ravitype_t, unsigned int)"
               );
}

Assistant:

static Pseudo *create_indexed_pseudo(Proc *proc, ravitype_t container_type,
				     Pseudo *container_pseudo, ravitype_t key_type,
				     Pseudo *key_pseudo, ravitype_t target_type, unsigned line_number)
{
	assert(container_pseudo->type != PSEUDO_INDEXED);
	assert(key_pseudo->type != PSEUDO_INDEXED);

	Pseudo *index_pseudo = allocate_indexed_pseudo(proc);
	index_pseudo->index_info.line_number = line_number;
	index_pseudo->index_info.container_type = container_type;
	index_pseudo->index_info.key_type = key_type;
	index_pseudo->index_info.target_type = target_type;
	index_pseudo->index_info.container = container_pseudo;
	index_pseudo->index_info.key = key_pseudo;
	index_pseudo->index_info.is_global = 0;
	return index_pseudo;
}